

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringDictionary.cpp
# Opt level: O3

string_view __thiscall
soul::StringDictionary::getStringForHandle(StringDictionary *this,Handle handle)

{
  pointer pIVar1;
  size_type sVar2;
  pointer pcVar3;
  string_view sVar4;
  
  if (handle.handle == 0) {
    pcVar3 = (pointer)0x0;
    sVar2 = 0;
  }
  else {
    pIVar1 = (this->strings).
             super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pIVar1 == (this->strings).
                    super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        throwInternalCompilerError("getStringForHandle",0x35);
      }
      if ((pIVar1->handle).handle == handle.handle) break;
      pIVar1 = pIVar1 + 1;
    }
    pcVar3 = (pIVar1->text)._M_dataplus._M_p;
    sVar2 = (pIVar1->text)._M_string_length;
  }
  sVar4._M_str = pcVar3;
  sVar4._M_len = sVar2;
  return sVar4;
}

Assistant:

std::string_view StringDictionary::getStringForHandle (Handle handle) const
    {
        if (handle == Handle())
            return {};

        for (auto& s : strings)
            if (s.handle == handle)
                return s.text;

        SOUL_ASSERT_FALSE;
        return {};
    }